

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DoFilter2_C(uint8_t *p,int step)

{
  byte bVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)step;
  bVar1 = p[-lVar5];
  bVar2 = *p;
  iVar4 = ((uint)bVar2 - (uint)bVar1) * 3;
  uVar3 = sclip2[(long)((char)sclip1[((ulong)p[lVar5 * -2] - (ulong)p[lVar5]) + 0x3fc] + iVar4 + 4
                       >> 3) + 0x70];
  p[-lVar5] = ""[(long)(char)sclip2[(long)((char)sclip1[((ulong)p[lVar5 * -2] - (ulong)p[lVar5]) +
                                                        0x3fc] + iVar4 + 3 >> 3) + 0x70] +
                 (ulong)bVar1 + 0xff];
  *p = ""[((ulong)bVar2 - (long)(char)uVar3) + 0xff];
  return;
}

Assistant:

static WEBP_INLINE void DoFilter2_C(uint8_t* p, int step) {
  const int p1 = p[-2*step], p0 = p[-step], q0 = p[0], q1 = p[step];
  const int a = 3 * (q0 - p0) + VP8ksclip1[p1 - q1];  // in [-893,892]
  const int a1 = VP8ksclip2[(a + 4) >> 3];            // in [-16,15]
  const int a2 = VP8ksclip2[(a + 3) >> 3];
  p[-step] = VP8kclip1[p0 + a2];
  p[    0] = VP8kclip1[q0 - a1];
}